

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O3

void __thiscall leveldb::_Test_IterMultiWithDelete::_Run(_Test_IterMultiWithDelete *this)

{
  DBTest *this_00;
  int iVar1;
  undefined4 extraout_var;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined1 local_241;
  DBTest *local_240;
  Status local_238;
  string local_230;
  string local_210;
  Status local_1f0 [2];
  uint local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  char *local_1d0;
  char *pcStack_1c8;
  int local_1c0;
  stringstream local_1b8 [392];
  Iterator *iter;
  
  local_240 = &this->super_DBTest;
  while( true ) {
    paVar3 = &local_210.field_2;
    paVar2 = &local_230.field_2;
    local_1d0 = (char *)CONCAT71(local_1d0._1_7_,true);
    pcStack_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c0 = 0x3b5;
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_230._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"a","");
    local_210._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"va","");
    local_241 = 0;
    local_1f0[0].state_ = local_230._M_dataplus._M_p;
    local_1e0 = (uint)local_210._M_dataplus._M_p;
    uStack_1dc = local_210._M_dataplus._M_p._4_4_;
    uStack_1d8 = (undefined4)local_210._M_string_length;
    uStack_1d4 = local_210._M_string_length._4_4_;
    (*local_240->db_->_vptr_DB[2])(&local_238,local_240->db_,&local_241,local_1f0,&local_1e0);
    test::Tester::IsOk((Tester *)&local_1d0,&local_238);
    if (local_238.state_ != (char *)0x0) {
      operator_delete__(local_238.state_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar3) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d0);
    local_1d0 = (char *)CONCAT71(local_1d0._1_7_,true);
    pcStack_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c0 = 0x3b6;
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_230._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"b","");
    local_210._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"vb","");
    local_241 = 0;
    local_1f0[0].state_ = local_230._M_dataplus._M_p;
    local_1e0 = (uint)local_210._M_dataplus._M_p;
    uStack_1dc = local_210._M_dataplus._M_p._4_4_;
    uStack_1d8 = (undefined4)local_210._M_string_length;
    uStack_1d4 = local_210._M_string_length._4_4_;
    (*local_240->db_->_vptr_DB[2])(&local_238,local_240->db_,&local_241,local_1f0,&local_1e0);
    test::Tester::IsOk((Tester *)&local_1d0,&local_238);
    if (local_238.state_ != (char *)0x0) {
      operator_delete__(local_238.state_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar3) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d0);
    local_1d0 = (char *)CONCAT71(local_1d0._1_7_,true);
    pcStack_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c0 = 0x3b7;
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_230._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"c","");
    local_210._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"vc","");
    local_241 = 0;
    local_1f0[0].state_ = local_230._M_dataplus._M_p;
    local_1e0 = (uint)local_210._M_dataplus._M_p;
    uStack_1dc = local_210._M_dataplus._M_p._4_4_;
    uStack_1d8 = (undefined4)local_210._M_string_length;
    uStack_1d4 = local_210._M_string_length._4_4_;
    (*local_240->db_->_vptr_DB[2])(&local_238,local_240->db_,&local_241,local_1f0,&local_1e0);
    test::Tester::IsOk((Tester *)&local_1d0,&local_238);
    if (local_238.state_ != (char *)0x0) {
      operator_delete__(local_238.state_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar3) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d0);
    local_1d0 = (char *)CONCAT71(local_1d0._1_7_,true);
    pcStack_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c0 = 0x3b8;
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_230._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"b","");
    local_1e0 = local_1e0 & 0xffffff00;
    local_210._M_dataplus._M_p = local_230._M_dataplus._M_p;
    local_210._M_string_length._0_4_ = (undefined4)local_230._M_string_length;
    local_210._M_string_length._4_4_ = local_230._M_string_length._4_4_;
    (*local_240->db_->_vptr_DB[3])(local_1f0,local_240->db_,&local_1e0);
    test::Tester::IsOk((Tester *)&local_1d0,local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0[0].state_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete__(local_1f0[0].state_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d0);
    local_1d0 = (char *)CONCAT71(local_1d0._1_7_,true);
    pcStack_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c0 = 0x3b9;
    std::__cxx11::stringstream::stringstream(local_1b8);
    local_210._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"b","");
    DBTest::Get(&local_230,local_240,&local_210,(Snapshot *)0x0);
    test::Tester::IsEq<char[10],std::__cxx11::string>
              ((Tester *)&local_1d0,(char (*) [10])"NOT_FOUND",&local_230);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != paVar3) {
      operator_delete(local_210._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d0);
    this_00 = local_240;
    pcStack_1c8 = (char *)0x0;
    local_1d0 = (char *)0x100;
    iVar1 = (*local_240->db_->_vptr_DB[6])(local_240->db_,(Tester *)&local_1d0);
    iter = (Iterator *)CONCAT44(extraout_var,iVar1);
    local_1d0 = "c";
    pcStack_1c8 = (char *)0x1;
    (*iter->_vptr_Iterator[5])(iter,(Tester *)&local_1d0);
    local_1d0 = (char *)CONCAT71(local_1d0._1_7_,true);
    pcStack_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c0 = 0x3bd;
    std::__cxx11::stringstream::stringstream(local_1b8);
    DBTest::IterStatus_abi_cxx11_(&local_230,this_00,iter);
    test::Tester::IsEq<std::__cxx11::string,char[6]>
              ((Tester *)&local_1d0,&local_230,(char (*) [6])"c->vc");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d0);
    (*iter->_vptr_Iterator[7])(iter);
    local_1d0 = (char *)CONCAT71(local_1d0._1_7_,true);
    pcStack_1c8 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc";
    local_1c0 = 0x3bf;
    std::__cxx11::stringstream::stringstream(local_1b8);
    DBTest::IterStatus_abi_cxx11_(&local_230,local_240,iter);
    test::Tester::IsEq<std::__cxx11::string,char[6]>
              ((Tester *)&local_1d0,&local_230,(char (*) [6])"a->va");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != &local_230.field_2) {
      operator_delete(local_230._M_dataplus._M_p);
    }
    test::Tester::~Tester((Tester *)&local_1d0);
    (*iter->_vptr_Iterator[1])(iter);
    iVar1 = local_240->option_config_;
    local_240->option_config_ = iVar1 + 1;
    if (2 < iVar1) break;
    DBTest::DestroyAndReopen(local_240,(Options *)0x0);
  }
  return;
}

Assistant:

TEST(DBTest, IterMultiWithDelete) {
  do {
    ASSERT_OK(Put("a", "va"));
    ASSERT_OK(Put("b", "vb"));
    ASSERT_OK(Put("c", "vc"));
    ASSERT_OK(Delete("b"));
    ASSERT_EQ("NOT_FOUND", Get("b"));

    Iterator* iter = db_->NewIterator(ReadOptions());
    iter->Seek("c");
    ASSERT_EQ(IterStatus(iter), "c->vc");
    iter->Prev();
    ASSERT_EQ(IterStatus(iter), "a->va");
    delete iter;
  } while (ChangeOptions());
}